

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.test.cpp
# Opt level: O3

TileData *
setTileInPool<tiles::Input>
          (TileData *__return_storage_ptr__,TilePool *pool,size_t sectorId,uint offset,
          TileData expected,Input *tileType,t tileId)

{
  t tVar1;
  uint offset_00;
  bool bVar2;
  TileData *pTVar3;
  Tile *this;
  t tVar4;
  AssertionHandler catchAssertionHandler;
  t local_109;
  uint local_108;
  TileData local_104;
  Input *local_100;
  TileData local_f4;
  Tile local_f0;
  AssertionHandler local_d8;
  ITransientExpression local_90;
  StringRef *local_80;
  TileType *local_78;
  Chunk *pCStack_70;
  TileData *local_68;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_90._vptr_ITransientExpression = (_func_int **)0x2200f3;
  local_90.m_isBinaryExpression = true;
  local_90.m_result = false;
  local_90._10_6_ = 0;
  local_f0.tileType_ = (TileType *)0x222f94;
  local_f0.chunk_ = (Chunk *)0x16;
  local_109 = tileId;
  local_104 = (TileData)offset;
  local_100 = tileType;
  Catch::StringRef::StringRef
            (&local_40,"pool.accessTile(sectorId, offset).getRawData() == expected");
  Catch::AssertionHandler::AssertionHandler
            (&local_d8,(StringRef *)&local_90,(SourceLineInfo *)&local_f0,local_40,Normal);
  local_108 = (uint)sectorId;
  this = (Tile *)__return_storage_ptr__;
  TilePool::accessTile(&local_f0,(TilePool *)__return_storage_ptr__,(size_t)pool,local_108);
  pTVar3 = Tile::getRawData((TileData *)&local_f0,this);
  local_f4 = SUB84(pTVar3,0);
  bVar2 = operator==(&local_f4,&local_104);
  Catch::StringRef::StringRef(&local_60,"==");
  local_90.m_result = bVar2;
  local_90.m_isBinaryExpression = true;
  local_90._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0028ff60;
  pCStack_70 = (Chunk *)local_60.m_size;
  local_80 = (StringRef *)&local_f4;
  local_68 = &local_104;
  Catch::AssertionHandler::handleExpr(&local_d8,&local_90);
  Catch::ITransientExpression::~ITransientExpression(&local_90);
  Catch::AssertionHandler::complete(&local_d8);
  if (local_d8.m_completed == false) {
    (*(local_d8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  offset_00 = local_108;
  TilePool::accessTile((Tile *)&local_d8,(TilePool *)__return_storage_ptr__,(size_t)pool,local_108);
  tVar1 = local_109;
  Tile::setType((Tile *)&local_d8,local_100,local_109,low,' ');
  TilePool::accessTile((Tile *)&local_d8,(TilePool *)__return_storage_ptr__,(size_t)pool,offset_00);
  pTVar3 = Tile::getRawData((TileData *)&local_d8,(Tile *)__return_storage_ptr__);
  local_108 = (uint)pTVar3;
  tVar4 = (t)pTVar3 & (gateXor|gateNor);
  local_90._vptr_ITransientExpression = (_func_int **)0x2200f3;
  local_90.m_isBinaryExpression = true;
  local_90.m_result = false;
  local_90._10_6_ = 0;
  local_f0.tileType_ = (TileType *)0x222f94;
  local_f0.chunk_ = (Chunk *)0x19;
  Catch::StringRef::StringRef(&local_50,"result.id == tileId");
  Catch::AssertionHandler::AssertionHandler
            (&local_d8,(StringRef *)&local_90,(SourceLineInfo *)&local_f0,local_50,Normal);
  local_60.m_start._0_1_ = tVar4;
  Catch::StringRef::StringRef((StringRef *)&local_f0,"==");
  local_90.m_result = tVar4 == tVar1;
  local_90.m_isBinaryExpression = true;
  local_90._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0028ffa0;
  local_78 = local_f0.tileType_;
  pCStack_70 = local_f0.chunk_;
  local_68 = (TileData *)&local_109;
  local_80 = &local_60;
  Catch::AssertionHandler::handleExpr(&local_d8,&local_90);
  Catch::ITransientExpression::~ITransientExpression(&local_90);
  Catch::AssertionHandler::complete(&local_d8);
  if (local_d8.m_completed == false) {
    (*(local_d8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return (TileData *)(ulong)local_108;
}

Assistant:

TileData setTileInPool(TilePool& pool, size_t sectorId, unsigned int offset, TileData expected, T* tileType, TileId::t tileId) {
    REQUIRE(pool.accessTile(sectorId, offset).getRawData() == expected);
    pool.accessTile(sectorId, offset).setType(tileType, tileId);
    TileData result = pool.accessTile(sectorId, offset).getRawData();
    REQUIRE(result.id == tileId);
    return result;
}